

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_7::Validator::CheckGlobalVar
          (Validator *this,Var *var,Global **out_global,Index *out_global_index)

{
  bool bVar1;
  Result result;
  size_type sVar2;
  const_reference ppGVar3;
  uint local_34;
  Index *pIStack_30;
  Index index;
  Index *out_global_index_local;
  Global **out_global_local;
  Var *var_local;
  Validator *this_local;
  
  pIStack_30 = out_global_index;
  out_global_index_local = (Index *)out_global;
  out_global_local = (Global **)var;
  var_local = (Var *)this;
  sVar2 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::size
                    (&this->current_module_->globals);
  result = CheckVar(this,(Index)sVar2,(Var *)out_global_local,"global",&local_34);
  bVar1 = Failed(result);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (out_global_index_local != (Index *)0x0) {
      ppGVar3 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::operator[]
                          (&this->current_module_->globals,(ulong)local_34);
      *(value_type *)out_global_index_local = *ppGVar3;
    }
    if (pIStack_30 != (Index *)0x0) {
      *pIStack_30 = local_34;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result Validator::CheckGlobalVar(const Var* var,
                                 const Global** out_global,
                                 Index* out_global_index) {
  Index index;
  CHECK_RESULT(
      CheckVar(current_module_->globals.size(), var, "global", &index));
  if (out_global) {
    *out_global = current_module_->globals[index];
  }
  if (out_global_index) {
    *out_global_index = index;
  }
  return Result::Ok;
}